

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void RunBench(Benchmark *b,int nthread,int siz)

{
  int iVar1;
  char *__format;
  ulong uVar2;
  uint n;
  uint uVar3;
  char suf [100];
  char mb [100];
  char local_f8 [112];
  char local_88 [104];
  
  if (nthread == 1) {
    n = 1;
    runN(b,1,siz);
    uVar2 = 1;
    if (ns < 1000000000) {
      do {
        iVar1 = 1000000000;
        if (ns / (long)(int)n != 0) {
          iVar1 = (int)(1000000000 / (long)(int)(ns / (long)(int)n));
        }
        iVar1 = iVar1 / 2 + iVar1;
        if ((int)(n * 100) < iVar1) {
          iVar1 = n * 100;
        }
        if (iVar1 < (int)(n + 1)) {
          iVar1 = n + 1;
        }
        n = 1;
        do {
          uVar3 = n;
          n = uVar3 * 10;
        } while ((int)n < iVar1);
        if (iVar1 < (int)(uVar3 * 5)) {
          n = uVar3 * 5;
        }
        if (iVar1 < (int)(uVar3 * 2)) {
          n = uVar3 * 2;
        }
        runN(b,n,siz);
      } while ((n < 1000000000) && (ns < 1000000000));
      uVar2 = (ulong)n;
    }
    local_88[0] = '\0';
    local_f8[0] = '\0';
    if (0 < bytes && 0 < ns) {
      snprintf(local_88,100,"\t%7.2f MB/s",((double)bytes / 1000000.0) / ((double)ns / 1000000000.0)
              );
    }
    if ((b->fnr != (_func_void_int_int *)0x0) || (b->lo != b->hi)) {
      if (siz < 0x100000) {
        if (siz < 0x400) {
          __format = "/%d";
        }
        else {
          siz = (uint)siz >> 10;
          __format = "/%dK";
        }
      }
      else {
        siz = (uint)siz >> 0x14;
        __format = "/%dM";
      }
      snprintf(local_f8,100,__format,(ulong)(uint)siz);
    }
    printf("%s%s\t%8lld\t%10lld ns/op%s\n",b->name,local_f8,uVar2,ns / (long)uVar2,local_88);
    fflush(_stdout);
  }
  return;
}

Assistant:

void RunBench(Benchmark* b, int nthread, int siz) {
	int n, last;

	// TODO(rsc): Threaded benchmarks.
	if(nthread != 1)
		return;
	
	// run once in case it's expensive
	n = 1;
	runN(b, n, siz);
	while(ns < (int)1e9 && n < (int)1e9) {
		last = n;
		if(ns/n == 0)
			n = (int)1e9;
		else
			n = (int)1e9 / static_cast<int>(ns/n);
		
		n = max(last+1, min(n+n/2, 100*last));
		n = round(n);
		runN(b, n, siz);
	}
	
	char mb[100];
	char suf[100];
	mb[0] = '\0';
	suf[0] = '\0';
	if(ns > 0 && bytes > 0)
		snprintf(mb, sizeof mb, "\t%7.2f MB/s", ((double)bytes/1e6)/((double)ns/1e9));
	if(b->fnr || b->lo != b->hi) {
		if(siz >= (1<<20))
			snprintf(suf, sizeof suf, "/%dM", siz/(1<<20));
		else if(siz >= (1<<10))
			snprintf(suf, sizeof suf, "/%dK", siz/(1<<10));
		else
			snprintf(suf, sizeof suf, "/%d", siz);
	}
	printf("%s%s\t%8lld\t%10lld ns/op%s\n", b->name, suf, (long long)n, (long long)ns/n, mb);
	fflush(stdout);
}